

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_certificate_request(mbedtls_ssl_context *ssl)

{
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ssl_ciphersuite_t *pmVar2;
  uchar *puVar3;
  uint uVar4;
  long lVar6;
  int iVar7;
  ushort uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar5;
  
  pmVar2 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0x9fc,"=> parse certificate request");
  mVar1 = pmVar2->key_exchange;
  if ((mVar1 - MBEDTLS_KEY_EXCHANGE_PSK < 4) || (mVar1 == MBEDTLS_KEY_EXCHANGE_ECJPAKE)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xa04,"<= skip parse certificate request");
    ssl->state = ssl->state + 1;
    return 0;
  }
  if (ssl->record_read == 0) {
    iVar7 = mbedtls_ssl_read_record(ssl);
    if (iVar7 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xa0d,"mbedtls_ssl_read_record",iVar7);
      return iVar7;
    }
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xa13,"bad certificate request message");
      return -0x7700;
    }
    ssl->record_read = 1;
  }
  ssl->client_auth = 0;
  ssl->state = ssl->state + 1;
  if (*ssl->in_msg == '\r') {
    ssl->client_auth = 1;
    pcVar9 = "a";
  }
  else {
    pcVar9 = "no";
  }
  iVar7 = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0xa21,"got %s certificate request",pcVar9);
  if (ssl->client_auth == 0) {
LAB_00120ab4:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xa72,"<= parse certificate request");
  }
  else {
    ssl->record_read = 0;
    puVar3 = ssl->in_msg;
    uVar4 = *(uint *)&ssl->conf->field_0x174 & 2;
    uVar5 = (ulong)uVar4;
    uVar10 = (ulong)puVar3[uVar5 * 4 + 4];
    uVar11 = ssl->in_hslen;
    if (uVar11 < uVar10 + uVar5 * 4 + 6) {
      iVar7 = 0xa48;
    }
    else {
      lVar6 = uVar5 * 4 + 4;
      if (ssl->minor_ver == 3) {
        uVar8 = *(ushort *)(puVar3 + uVar10 + uVar5 * 4 + 5) << 8 |
                *(ushort *)(puVar3 + uVar10 + uVar5 * 4 + 5) >> 8;
        if (uVar8 != 0) {
          uVar11 = 0;
          do {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0xa58,"Supported Signature Algorithm found: %d,%d",
                       (ulong)puVar3[uVar11 + lVar6 + uVar10 + 3],
                       (uint)puVar3[uVar11 + lVar6 + uVar10 + 4]);
            uVar11 = uVar11 + 2;
          } while (uVar11 < uVar8);
          uVar11 = ssl->in_hslen;
          uVar4 = *(uint *)&ssl->conf->field_0x174 & 2;
        }
        uVar10 = uVar10 + 2 + (ulong)uVar8;
        if (uVar11 < uVar10 + (ulong)(uVar4 != 0) * 8 + 6) {
          iVar7 = 0xa60;
          goto LAB_00120af6;
        }
        lVar6 = (ulong)(uVar4 != 0) * 8 + 4;
      }
      if (uVar11 == (ulong)(ushort)(*(ushort *)(puVar3 + uVar10 + 1 + lVar6) << 8 |
                                   *(ushort *)(puVar3 + uVar10 + 1 + lVar6) >> 8) + uVar10 + lVar6 +
                    3) goto LAB_00120ab4;
      iVar7 = 0xa6d;
    }
LAB_00120af6:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar7,"bad certificate request message");
    iVar7 = -0x7a80;
  }
  return iVar7;
}

Assistant:

static int ssl_parse_certificate_request( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf;
    size_t n = 0;
    size_t cert_type_len = 0, dn_len = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate request" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate request" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->record_read == 0 )
    {
        if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
            return( ret );
        }

        if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        ssl->record_read = 1;
    }

    ssl->client_auth = 0;
    ssl->state++;

    if( ssl->in_msg[0] == MBEDTLS_SSL_HS_CERTIFICATE_REQUEST )
        ssl->client_auth++;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "got %s certificate request",
                        ssl->client_auth ? "a" : "no" ) );

    if( ssl->client_auth == 0 )
        goto exit;

    ssl->record_read = 0;

    /*
     *  struct {
     *      ClientCertificateType certificate_types<1..2^8-1>;
     *      SignatureAndHashAlgorithm
     *        supported_signature_algorithms<2^16-1>; -- TLS 1.2 only
     *      DistinguishedName certificate_authorities<0..2^16-1>;
     *  } CertificateRequest;
     *
     *  Since we only support a single certificate on clients, let's just
     *  ignore all the information that's supposed to help us pick a
     *  certificate.
     *
     *  We could check that our certificate matches the request, and bail out
     *  if it doesn't, but it's simpler to just send the certificate anyway,
     *  and give the server the opportunity to decide if it should terminate
     *  the connection when it doesn't like our certificate.
     *
     *  Same goes for the hash in TLS 1.2's signature_algorithms: at this
     *  point we only have one hash available (see comments in
     *  write_certificate_verify), so let's just use what we have.
     *
     *  However, we still minimally parse the message to check it is at least
     *  superficially sane.
     */
    buf = ssl->in_msg;

    /* certificate_types */
    cert_type_len = buf[mbedtls_ssl_hs_hdr_len( ssl )];
    n = cert_type_len;

    if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

    /* supported_signature_algorithms */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        size_t sig_alg_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + n] <<  8 )
                             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n]       ) );
#if defined(MBEDTLS_DEBUG_C)
        unsigned char* sig_alg = buf + mbedtls_ssl_hs_hdr_len( ssl ) + 3 + n;
        size_t i;

        for( i = 0; i < sig_alg_len; i += 2 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "Supported Signature Algorithm found: %d,%d", sig_alg[i], sig_alg[i + 1]  ) );
        }
#endif

        n += 2 + sig_alg_len;

        if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    /* certificate_authorities */
    dn_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + n] <<  8 )
             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n]       ) );

    n += dn_len;
    if( ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 3 + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

exit:
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate request" ) );

    return( 0 );
}